

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pattern.h
# Opt level: O3

double ZXing::IsPattern<false,3,4>
                 (PatternView *view,FixedPattern<3,_4,_false> *pattern,int spaceInPixel,
                 double minQuietZone,double moduleSizeRef)

{
  Iterator puVar1;
  ushort uVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  
  puVar1 = view->_data;
  uVar2 = puVar1[1] + *puVar1 + puVar1[2];
  if (3 < uVar2) {
    dVar5 = (double)uVar2 * 0.25;
    if (((minQuietZone == 0.0) && (!NAN(minQuietZone))) ||
       (minQuietZone * dVar5 + -1.0 <= (double)spaceInPixel)) {
      dVar4 = (double)(~-(ulong)(moduleSizeRef != 0.0) & (ulong)dVar5 |
                      (ulong)moduleSizeRef & -(ulong)(moduleSizeRef != 0.0));
      lVar3 = 0;
      while (ABS((double)puVar1[lVar3] - (double)pattern->_data[lVar3] * dVar4) <= dVar4 * 0.5 + 0.5
            ) {
        lVar3 = lVar3 + 1;
        if (lVar3 == 3) {
          return dVar5;
        }
      }
    }
  }
  return 0.0;
}

Assistant:

double IsPattern(const PatternView& view, const FixedPattern<LEN, SUM, false>& pattern, int spaceInPixel = 0,
				double minQuietZone = 0, double moduleSizeRef = 0)
{
	if constexpr (E2E) {
		auto widths = BarAndSpaceSum<LEN, double>(view.data());
		auto sums = pattern.sums();
		BarAndSpace<double> modSize = {widths[0] / sums[0], widths[1] / sums[1]};

		auto [m, M] = std::minmax(modSize[0], modSize[1]);
		if (M > 4 * m) // make sure module sizes of bars and spaces are not too far away from each other
			return 0;

		if (minQuietZone && spaceInPixel < minQuietZone * modSize.space)
			return 0;

		const BarAndSpace<double> thr = {modSize[0] * .75 + .5, modSize[1] / (2 + (LEN < 6)) + .5};

		for (int x = 0; x < LEN; ++x)
			if (std::abs(view[x] - pattern[x] * modSize[x]) > thr[x])
				return 0;

		return (modSize[0] + modSize[1]) / 2;
	}

	double width = view.sum(LEN);
	if (SUM > LEN && width < SUM)
		return 0;

	const auto moduleSize = width / SUM;

	if (minQuietZone && spaceInPixel < minQuietZone * moduleSize - 1)
		return 0;

	if (!moduleSizeRef)
		moduleSizeRef = moduleSize;

	// the offset of 0.5 is to make the code less sensitive to quantization errors for small (near 1) module sizes.
	// TODO: review once we have upsampling in the binarizer in place.
	const auto threshold = moduleSizeRef * (0.5 + E2E * 0.25) + 0.5;

	for (int x = 0; x < LEN; ++x)
		if (std::abs(view[x] - pattern[x] * moduleSizeRef) > threshold)
			return 0;

	return moduleSize;
}